

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t header_gnutar(archive_read *a,tar *tar,archive_entry *entry,void *h,int64_t *unconsumed)

{
  wchar_t wVar1;
  char *pcVar2;
  dev_t dVar3;
  int64_t iVar4;
  char *existing_gname;
  char *existing_uname;
  char *existing_pathname;
  wchar_t err;
  int64_t t;
  archive_entry_header_gnutar *header;
  int64_t *unconsumed_local;
  void *h_local;
  archive_entry *entry_local;
  tar *tar_local;
  archive_read *a_local;
  
  pcVar2 = archive_entry_pathname(entry);
  if ((((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) &&
      (wVar1 = _archive_entry_copy_pathname_l(entry,(char *)h,100,tar->sconv), wVar1 != L'\0')) &&
     (wVar1 = set_conversion_failed_error(a,tar->sconv,"Pathname"), wVar1 == L'\xffffffe2')) {
    a_local._4_4_ = L'\xffffffe2';
  }
  else {
    pcVar2 = archive_entry_uname(entry);
    if (((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) &&
       ((wVar1 = _archive_entry_copy_uname_l(entry,(char *)((long)h + 0x109),0x20,tar->sconv),
        wVar1 != L'\0' &&
        (wVar1 = set_conversion_failed_error(a,tar->sconv,"Uname"), wVar1 == L'\xffffffe2')))) {
      a_local._4_4_ = L'\xffffffe2';
    }
    else {
      pcVar2 = archive_entry_gname(entry);
      if (((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) &&
         ((wVar1 = _archive_entry_copy_gname_l(entry,(char *)((long)h + 0x129),0x20,tar->sconv),
          wVar1 != L'\0' &&
          (wVar1 = set_conversion_failed_error(a,tar->sconv,"Gname"), wVar1 == L'\xffffffe2')))) {
        a_local._4_4_ = L'\xffffffe2';
      }
      else {
        if ((*(char *)((long)h + 0x9c) == '3') || (*(char *)((long)h + 0x9c) == '4')) {
          wVar1 = archive_entry_rdev_is_set(entry);
          if (wVar1 == L'\0') {
            dVar3 = tar_atol((char *)((long)h + 0x149),8);
            archive_entry_set_rdevmajor(entry,dVar3);
            dVar3 = tar_atol((char *)((long)h + 0x151),8);
            archive_entry_set_rdevminor(entry,dVar3);
          }
        }
        else {
          archive_entry_set_rdev(entry,0);
        }
        wVar1 = archive_entry_atime_is_set(entry);
        if ((wVar1 == L'\0') && (iVar4 = tar_atol((char *)((long)h + 0x159),0xc), 0 < iVar4)) {
          archive_entry_set_atime(entry,iVar4,0);
        }
        wVar1 = archive_entry_ctime_is_set(entry);
        if ((wVar1 == L'\0') && (iVar4 = tar_atol((char *)((long)h + 0x165),0xc), 0 < iVar4)) {
          archive_entry_set_ctime(entry,iVar4,0);
        }
        if (*(char *)((long)h + 0x1e3) != '\0') {
          iVar4 = tar_atol((char *)((long)h + 0x1e3),0xc);
          tar->GNU_sparse_realsize = iVar4;
          tar->size_fields = tar->size_fields | 2;
        }
        if ((*(char *)((long)h + 0x182) == '\0') ||
           (wVar1 = gnu_sparse_old_read(a,tar,(archive_entry_header_gnutar *)h,unconsumed),
           wVar1 == L'\0')) {
          a_local._4_4_ = header_common(a,tar,entry,h);
          if (a_local._4_4_ != L'\xffffffe2') {
            tar->entry_padding = -tar->entry_bytes_remaining & 0x1ff;
          }
        }
        else {
          a_local._4_4_ = L'\xffffffe2';
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
header_gnutar(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h, int64_t *unconsumed)
{
	const struct archive_entry_header_gnutar *header;
	int64_t t;
	int err = ARCHIVE_OK;

	/*
	 * GNU header is like POSIX ustar, except 'prefix' is
	 * replaced with some other fields. This also means the
	 * filename is stored as in old-style archives.
	 */

	/* Copy filename over (to ensure null termination). */
	header = (const struct archive_entry_header_gnutar *)h;
	const char *existing_pathname = archive_entry_pathname(entry);
	if (existing_pathname == NULL || existing_pathname[0] == '\0') {
		if (archive_entry_copy_pathname_l(entry,
		    header->name, sizeof(header->name), tar->sconv) != 0) {
			err = set_conversion_failed_error(a, tar->sconv, "Pathname");
			if (err == ARCHIVE_FATAL)
				return (err);
		}
	}

	/* Fields common to ustar and GNU */
	/* XXX Can the following be factored out since it's common
	 * to ustar and gnu tar?  Is it okay to move it down into
	 * header_common, perhaps?  */
	const char *existing_uname = archive_entry_uname(entry);
	if (existing_uname == NULL || existing_uname[0] == '\0') {
		if (archive_entry_copy_uname_l(entry,
		    header->uname, sizeof(header->uname), tar->sconv) != 0) {
			err = set_conversion_failed_error(a, tar->sconv, "Uname");
			if (err == ARCHIVE_FATAL)
				return (err);
		}
	}

	const char *existing_gname = archive_entry_gname(entry);
	if (existing_gname == NULL || existing_gname[0] == '\0') {
		if (archive_entry_copy_gname_l(entry,
		    header->gname, sizeof(header->gname), tar->sconv) != 0) {
			err = set_conversion_failed_error(a, tar->sconv, "Gname");
			if (err == ARCHIVE_FATAL)
				return (err);
		}
	}

	/* Parse out device numbers only for char and block specials */
	if (header->typeflag[0] == '3' || header->typeflag[0] == '4') {
		if (!archive_entry_rdev_is_set(entry)) {
			archive_entry_set_rdevmajor(entry, (dev_t)
			    tar_atol(header->rdevmajor, sizeof(header->rdevmajor)));
			archive_entry_set_rdevminor(entry, (dev_t)
			    tar_atol(header->rdevminor, sizeof(header->rdevminor)));
		}
	} else {
		archive_entry_set_rdev(entry, 0);
	}

	/* Grab GNU-specific fields. */
	if (!archive_entry_atime_is_set(entry)) {
		t = tar_atol(header->atime, sizeof(header->atime));
		if (t > 0)
			archive_entry_set_atime(entry, t, 0);
	}
	if (!archive_entry_ctime_is_set(entry)) {
		t = tar_atol(header->ctime, sizeof(header->ctime));
		if (t > 0)
			archive_entry_set_ctime(entry, t, 0);
	}

	if (header->realsize[0] != 0) {
		/* Treat as a synonym for the pax GNU.sparse.realsize attr */
		tar->GNU_sparse_realsize
		    = tar_atol(header->realsize, sizeof(header->realsize));
		tar->size_fields |= TAR_SIZE_GNU_SPARSE_REALSIZE;
	}

	if (header->sparse[0].offset[0] != 0) {
		if (gnu_sparse_old_read(a, tar, header, unconsumed)
		    != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	} else {
		if (header->isextended[0] != 0) {
			/* XXX WTF? XXX */
		}
	}

	/* Grab fields common to all tar variants. */
	err = header_common(a, tar, entry, h);
	if (err == ARCHIVE_FATAL)
		return (err);

	tar->entry_padding = 0x1ff & (-tar->entry_bytes_remaining);

	return (err);
}